

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XmlRpcDispatch.cpp
# Opt level: O0

void __thiscall XmlRpc::XmlRpcDispatch::work(XmlRpcDispatch *this,double timeout)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  size_type sVar5;
  uint *puVar6;
  reference pvVar7;
  int *piVar8;
  reference ppXVar9;
  XmlRpcSource *pXVar10;
  pointer pMVar11;
  reference this_00;
  list<XmlRpc::XmlRpcDispatch::MonitoredSource,_std::allocator<XmlRpc::XmlRpcDispatch::MonitoredSource>_>
  *in_RDI;
  double in_XMM0_Qa;
  double dVar12;
  XmlRpcSource *src_1;
  MonitoredSource *ms;
  iterator __end3;
  iterator __begin3;
  SourceList *__range3;
  SourceList closeList;
  iterator thisIt;
  bool oob;
  bool writable;
  bool readable;
  uint newMask;
  pollfd *pfd;
  XmlRpcSource *src;
  int nEvents;
  uint mask;
  size_t i;
  iterator it;
  vector<XmlRpc::XmlRpcSource_*,_std::allocator<XmlRpc::XmlRpcSource_*>_> sources;
  vector<pollfd,_std::allocator<pollfd>_> fds;
  uint source_cnt;
  int timeout_ms;
  uint POLLEX_CHK;
  uint POLLEX_REQ;
  uint POLLOUT_CHK;
  uint POLLOUT_REQ;
  uint POLLIN_CHK;
  uint POLLIN_REQ;
  undefined4 in_stack_fffffffffffffe08;
  undefined4 in_stack_fffffffffffffe0c;
  XmlRpcDispatch *in_stack_fffffffffffffe10;
  const_iterator in_stack_fffffffffffffe18;
  undefined4 in_stack_fffffffffffffe20;
  uint in_stack_fffffffffffffe24;
  uint *in_stack_fffffffffffffe28;
  undefined7 in_stack_fffffffffffffe30;
  undefined1 in_stack_fffffffffffffe37;
  uint in_stack_fffffffffffffe48;
  uint in_stack_fffffffffffffe4c;
  _List_node_base *local_150;
  _Self local_130;
  _Self local_128;
  undefined1 *local_120;
  undefined1 local_118 [24];
  _List_node_base *local_100;
  _List_const_iterator<XmlRpc::XmlRpcDispatch::MonitoredSource> local_f8;
  _Self local_f0;
  _List_node_base *local_e8;
  _Self local_e0;
  _List_node_base *local_d8;
  _List_iterator<XmlRpc::XmlRpcDispatch::MonitoredSource> local_d0;
  byte local_c7;
  byte local_c6;
  undefined1 local_c5;
  uint local_c4;
  reference local_c0;
  value_type local_b8;
  int local_ac;
  uint local_a8;
  uint local_a4;
  _Self local_a0;
  _List_node_base *local_98;
  size_type local_90;
  _List_iterator<XmlRpc::XmlRpcDispatch::MonitoredSource> local_88 [2];
  vector<XmlRpc::XmlRpcSource_*,_std::allocator<XmlRpc::XmlRpcSource_*>_> local_78 [2];
  vector<pollfd,_std::allocator<pollfd>_> local_48;
  uint local_30;
  int local_2c;
  undefined4 local_28;
  undefined4 local_24;
  undefined4 local_20;
  undefined4 local_1c;
  undefined4 local_18;
  undefined4 local_14;
  double local_10;
  
  local_14 = 1;
  local_18 = 0x19;
  local_1c = 4;
  local_20 = 0xc;
  local_24 = 2;
  local_28 = 0x22;
  local_10 = in_XMM0_Qa;
  if (0.0 <= in_XMM0_Qa) {
    dVar12 = getTime(in_stack_fffffffffffffe10);
    local_150 = (_List_node_base *)(dVar12 + local_10);
  }
  else {
    local_150 = (_List_node_base *)0xbff0000000000000;
  }
  in_RDI[1].
  super__List_base<XmlRpc::XmlRpcDispatch::MonitoredSource,_std::allocator<XmlRpc::XmlRpcDispatch::MonitoredSource>_>
  ._M_impl._M_node.super__List_node_base._M_next = local_150;
  *(undefined1 *)
   &in_RDI[1].
    super__List_base<XmlRpc::XmlRpcDispatch::MonitoredSource,_std::allocator<XmlRpc::XmlRpcDispatch::MonitoredSource>_>
    ._M_impl._M_node.super__List_node_base._M_prev = 0;
  *(undefined1 *)
   ((long)&in_RDI[1].
           super__List_base<XmlRpc::XmlRpcDispatch::MonitoredSource,_std::allocator<XmlRpc::XmlRpcDispatch::MonitoredSource>_>
           ._M_impl._M_node.super__List_node_base._M_prev + 1) = 1;
  dVar12 = floor(local_10 * 1000.0);
  local_2c = (int)dVar12;
  do {
    bVar1 = std::__cxx11::
            list<XmlRpc::XmlRpcDispatch::MonitoredSource,_std::allocator<XmlRpc::XmlRpcDispatch::MonitoredSource>_>
            ::empty(in_RDI);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
LAB_00562bfe:
      *(undefined1 *)
       ((long)&in_RDI[1].
               super__List_base<XmlRpc::XmlRpcDispatch::MonitoredSource,_std::allocator<XmlRpc::XmlRpcDispatch::MonitoredSource>_>
               ._M_impl._M_node.super__List_node_base._M_prev + 1) = 0;
      return;
    }
    sVar5 = std::__cxx11::
            list<XmlRpc::XmlRpcDispatch::MonitoredSource,_std::allocator<XmlRpc::XmlRpcDispatch::MonitoredSource>_>
            ::size(&in_stack_fffffffffffffe10->_sources);
    local_30 = (uint)sVar5;
    std::allocator<pollfd>::allocator((allocator<pollfd> *)0x562319);
    std::vector<pollfd,_std::allocator<pollfd>_>::vector
              ((vector<pollfd,_std::allocator<pollfd>_> *)
               CONCAT17(in_stack_fffffffffffffe37,in_stack_fffffffffffffe30),
               (size_type)in_stack_fffffffffffffe28,
               (allocator_type *)CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20));
    std::allocator<pollfd>::~allocator((allocator<pollfd> *)0x562345);
    std::allocator<XmlRpc::XmlRpcSource_*>::allocator((allocator<XmlRpc::XmlRpcSource_*> *)0x562369)
    ;
    std::vector<XmlRpc::XmlRpcSource_*,_std::allocator<XmlRpc::XmlRpcSource_*>_>::vector
              ((vector<XmlRpc::XmlRpcSource_*,_std::allocator<XmlRpc::XmlRpcSource_*>_> *)
               CONCAT17(in_stack_fffffffffffffe37,in_stack_fffffffffffffe30),
               (size_type)in_stack_fffffffffffffe28,
               (allocator_type *)CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20));
    std::allocator<XmlRpc::XmlRpcSource_*>::~allocator
              ((allocator<XmlRpc::XmlRpcSource_*> *)0x562395);
    std::_List_iterator<XmlRpc::XmlRpcDispatch::MonitoredSource>::_List_iterator(local_88);
    local_90 = 0;
    local_98 = (_List_node_base *)
               std::__cxx11::
               list<XmlRpc::XmlRpcDispatch::MonitoredSource,_std::allocator<XmlRpc::XmlRpcDispatch::MonitoredSource>_>
               ::begin((list<XmlRpc::XmlRpcDispatch::MonitoredSource,_std::allocator<XmlRpc::XmlRpcDispatch::MonitoredSource>_>
                        *)CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08));
    local_88[0]._M_node = local_98;
    while( true ) {
      local_a0._M_node =
           (_List_node_base *)
           std::__cxx11::
           list<XmlRpc::XmlRpcDispatch::MonitoredSource,_std::allocator<XmlRpc::XmlRpcDispatch::MonitoredSource>_>
           ::end((list<XmlRpc::XmlRpcDispatch::MonitoredSource,_std::allocator<XmlRpc::XmlRpcDispatch::MonitoredSource>_>
                  *)CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08));
      bVar1 = std::operator!=(local_88,&local_a0);
      if (!bVar1) break;
      pMVar11 = std::_List_iterator<XmlRpc::XmlRpcDispatch::MonitoredSource>::operator->
                          ((_List_iterator<XmlRpc::XmlRpcDispatch::MonitoredSource> *)0x562413);
      pXVar10 = MonitoredSource::getSource(pMVar11);
      ppXVar9 = std::vector<XmlRpc::XmlRpcSource_*,_std::allocator<XmlRpc::XmlRpcSource_*>_>::
                operator[](local_78,local_90);
      *ppXVar9 = pXVar10;
      ppXVar9 = std::vector<XmlRpc::XmlRpcSource_*,_std::allocator<XmlRpc::XmlRpcSource_*>_>::
                operator[](local_78,local_90);
      iVar2 = XmlRpcSource::getfd(*ppXVar9);
      pvVar7 = std::vector<pollfd,_std::allocator<pollfd>_>::operator[](&local_48,local_90);
      pvVar7->fd = iVar2;
      pvVar7 = std::vector<pollfd,_std::allocator<pollfd>_>::operator[](&local_48,local_90);
      pvVar7->revents = 0;
      pvVar7 = std::vector<pollfd,_std::allocator<pollfd>_>::operator[](&local_48,local_90);
      pvVar7->events = 0;
      pMVar11 = std::_List_iterator<XmlRpc::XmlRpcDispatch::MonitoredSource>::operator->
                          ((_List_iterator<XmlRpc::XmlRpcDispatch::MonitoredSource> *)0x5624c7);
      puVar6 = MonitoredSource::getMask(pMVar11);
      local_a4 = *puVar6;
      if ((local_a4 & 1) != 0) {
        pvVar7 = std::vector<pollfd,_std::allocator<pollfd>_>::operator[](&local_48,local_90);
        pvVar7->events = pvVar7->events | 1;
      }
      if ((local_a4 & 2) != 0) {
        pvVar7 = std::vector<pollfd,_std::allocator<pollfd>_>::operator[](&local_48,local_90);
        pvVar7->events = pvVar7->events | 4;
      }
      if ((local_a4 & 4) != 0) {
        pvVar7 = std::vector<pollfd,_std::allocator<pollfd>_>::operator[](&local_48,local_90);
        pvVar7->events = pvVar7->events | 2;
      }
      std::_List_iterator<XmlRpc::XmlRpcDispatch::MonitoredSource>::operator++(local_88);
      local_90 = local_90 + 1;
    }
    pvVar7 = std::vector<pollfd,_std::allocator<pollfd>_>::operator[](&local_48,0);
    iVar2 = local_2c;
    if (local_2c < 0) {
      iVar2 = -1;
    }
    uVar3 = poll((pollfd *)pvVar7,(ulong)local_30,iVar2);
    local_a8 = uVar3;
    if ((int)uVar3 < 0) {
      piVar8 = __errno_location();
      if (*piVar8 != 4) {
        XmlRpcUtil::error("Error in XmlRpcDispatch::work: error in poll (%d).",(ulong)local_a8);
      }
      *(undefined1 *)
       ((long)&in_RDI[1].
               super__List_base<XmlRpc::XmlRpcDispatch::MonitoredSource,_std::allocator<XmlRpc::XmlRpcDispatch::MonitoredSource>_>
               ._M_impl._M_node.super__List_node_base._M_prev + 1) = 0;
      local_ac = 1;
    }
    else {
      for (local_90 = 0; local_90 < local_30; local_90 = local_90 + 1) {
        ppXVar9 = std::vector<XmlRpc::XmlRpcSource_*,_std::allocator<XmlRpc::XmlRpcSource_*>_>::
                  operator[](local_78,local_90);
        local_b8 = *ppXVar9;
        local_c0 = std::vector<pollfd,_std::allocator<pollfd>_>::operator[](&local_48,local_90);
        local_c4 = 0xffffffff;
        local_c5 = (local_c0->events & 1U) == 1;
        local_c6 = (local_c0->events & 4U) == 4;
        local_c7 = (local_c0->events & 2U) == 2;
        if (((bool)local_c5) && ((local_c0->revents & 0x19U) != 0)) {
          in_stack_fffffffffffffe4c = (*local_b8->_vptr_XmlRpcSource[3])(local_b8,1);
          local_c4 = in_stack_fffffffffffffe4c & local_c4;
        }
        if (((local_c6 & 1) != 0) && ((local_c0->revents & 0xcU) != 0)) {
          in_stack_fffffffffffffe48 = (*local_b8->_vptr_XmlRpcSource[3])(local_b8,2);
          local_c4 = in_stack_fffffffffffffe48 & local_c4;
        }
        if (((local_c7 & 1) != 0) && ((local_c0->revents & 0x22U) != 0)) {
          uVar4 = (*local_b8->_vptr_XmlRpcSource[3])(local_b8,4);
          local_c4 = uVar4 & local_c4;
        }
        std::_List_iterator<XmlRpc::XmlRpcDispatch::MonitoredSource>::_List_iterator(&local_d0);
        local_d8 = (_List_node_base *)
                   std::__cxx11::
                   list<XmlRpc::XmlRpcDispatch::MonitoredSource,_std::allocator<XmlRpc::XmlRpcDispatch::MonitoredSource>_>
                   ::begin((list<XmlRpc::XmlRpcDispatch::MonitoredSource,_std::allocator<XmlRpc::XmlRpcDispatch::MonitoredSource>_>
                            *)CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08));
        local_d0._M_node = local_d8;
        while( true ) {
          local_e0._M_node =
               (_List_node_base *)
               std::__cxx11::
               list<XmlRpc::XmlRpcDispatch::MonitoredSource,_std::allocator<XmlRpc::XmlRpcDispatch::MonitoredSource>_>
               ::end((list<XmlRpc::XmlRpcDispatch::MonitoredSource,_std::allocator<XmlRpc::XmlRpcDispatch::MonitoredSource>_>
                      *)CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08));
          bVar1 = std::operator!=(&local_d0,&local_e0);
          if (!bVar1) break;
          pMVar11 = std::_List_iterator<XmlRpc::XmlRpcDispatch::MonitoredSource>::operator->
                              ((_List_iterator<XmlRpc::XmlRpcDispatch::MonitoredSource> *)0x5628cc);
          pXVar10 = MonitoredSource::getSource(pMVar11);
          if (pXVar10 == local_b8) break;
          local_e8 = (_List_node_base *)
                     std::_List_iterator<XmlRpc::XmlRpcDispatch::MonitoredSource>::operator++
                               (&local_d0,0);
        }
        local_f0._M_node =
             (_List_node_base *)
             std::__cxx11::
             list<XmlRpc::XmlRpcDispatch::MonitoredSource,_std::allocator<XmlRpc::XmlRpcDispatch::MonitoredSource>_>
             ::end((list<XmlRpc::XmlRpcDispatch::MonitoredSource,_std::allocator<XmlRpc::XmlRpcDispatch::MonitoredSource>_>
                    *)CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08));
        bVar1 = std::operator==(&local_d0,&local_f0);
        if (bVar1) {
          XmlRpcUtil::error("Error in XmlRpcDispatch::work: couldn\'t find source iterator");
        }
        else if (local_c4 == 0) {
          std::_List_const_iterator<XmlRpc::XmlRpcDispatch::MonitoredSource>::_List_const_iterator
                    (&local_f8,&local_d0);
          local_100 = (_List_node_base *)
                      std::__cxx11::
                      list<XmlRpc::XmlRpcDispatch::MonitoredSource,_std::allocator<XmlRpc::XmlRpcDispatch::MonitoredSource>_>
                      ::erase(&in_stack_fffffffffffffe10->_sources,in_stack_fffffffffffffe18);
          in_stack_fffffffffffffe37 = XmlRpcSource::getKeepOpen(local_b8);
          if (!(bool)in_stack_fffffffffffffe37) {
            (*local_b8->_vptr_XmlRpcSource[2])();
          }
        }
        else if (local_c4 != 0xffffffff) {
          in_stack_fffffffffffffe24 = local_c4;
          pMVar11 = std::_List_iterator<XmlRpc::XmlRpcDispatch::MonitoredSource>::operator->
                              ((_List_iterator<XmlRpc::XmlRpcDispatch::MonitoredSource> *)0x5629de);
          in_stack_fffffffffffffe28 = MonitoredSource::getMask(pMVar11);
          *in_stack_fffffffffffffe28 = in_stack_fffffffffffffe24;
        }
      }
      if (((ulong)in_RDI[1].
                  super__List_base<XmlRpc::XmlRpcDispatch::MonitoredSource,_std::allocator<XmlRpc::XmlRpcDispatch::MonitoredSource>_>
                  ._M_impl._M_node.super__List_node_base._M_prev & 1) != 0) {
        std::__cxx11::
        list<XmlRpc::XmlRpcDispatch::MonitoredSource,_std::allocator<XmlRpc::XmlRpcDispatch::MonitoredSource>_>
        ::list((list<XmlRpc::XmlRpcDispatch::MonitoredSource,_std::allocator<XmlRpc::XmlRpcDispatch::MonitoredSource>_>
                *)CONCAT44(iVar2,uVar3),
               (list<XmlRpc::XmlRpcDispatch::MonitoredSource,_std::allocator<XmlRpc::XmlRpcDispatch::MonitoredSource>_>
                *)CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48));
        std::__cxx11::
        list<XmlRpc::XmlRpcDispatch::MonitoredSource,_std::allocator<XmlRpc::XmlRpcDispatch::MonitoredSource>_>
        ::clear(&in_stack_fffffffffffffe10->_sources);
        local_120 = local_118;
        local_128._M_node =
             (_List_node_base *)
             std::__cxx11::
             list<XmlRpc::XmlRpcDispatch::MonitoredSource,_std::allocator<XmlRpc::XmlRpcDispatch::MonitoredSource>_>
             ::begin((list<XmlRpc::XmlRpcDispatch::MonitoredSource,_std::allocator<XmlRpc::XmlRpcDispatch::MonitoredSource>_>
                      *)CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08));
        local_130._M_node =
             (_List_node_base *)
             std::__cxx11::
             list<XmlRpc::XmlRpcDispatch::MonitoredSource,_std::allocator<XmlRpc::XmlRpcDispatch::MonitoredSource>_>
             ::end((list<XmlRpc::XmlRpcDispatch::MonitoredSource,_std::allocator<XmlRpc::XmlRpcDispatch::MonitoredSource>_>
                    *)CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08));
        while (bVar1 = std::operator!=(&local_128,&local_130), bVar1) {
          this_00 = std::_List_iterator<XmlRpc::XmlRpcDispatch::MonitoredSource>::operator*
                              ((_List_iterator<XmlRpc::XmlRpcDispatch::MonitoredSource> *)0x562ab1);
          in_stack_fffffffffffffe18._M_node = (_List_node_base *)MonitoredSource::getSource(this_00)
          ;
          if ((XmlRpcSource *)in_stack_fffffffffffffe18._M_node != (XmlRpcSource *)0x0) {
            (*((XmlRpcSource *)in_stack_fffffffffffffe18._M_node)->_vptr_XmlRpcSource[2])();
          }
          std::_List_iterator<XmlRpc::XmlRpcDispatch::MonitoredSource>::operator++(&local_128);
        }
        *(undefined1 *)
         &in_RDI[1].
          super__List_base<XmlRpc::XmlRpcDispatch::MonitoredSource,_std::allocator<XmlRpc::XmlRpcDispatch::MonitoredSource>_>
          ._M_impl._M_node.super__List_node_base._M_prev = 0;
        std::__cxx11::
        list<XmlRpc::XmlRpcDispatch::MonitoredSource,_std::allocator<XmlRpc::XmlRpcDispatch::MonitoredSource>_>
        ::~list((list<XmlRpc::XmlRpcDispatch::MonitoredSource,_std::allocator<XmlRpc::XmlRpcDispatch::MonitoredSource>_>
                 *)0x562b4d);
      }
      if (((double)in_RDI[1].
                   super__List_base<XmlRpc::XmlRpcDispatch::MonitoredSource,_std::allocator<XmlRpc::XmlRpcDispatch::MonitoredSource>_>
                   ._M_impl._M_node.super__List_node_base._M_next < 0.0) ||
         (in_stack_fffffffffffffe10 = (XmlRpcDispatch *)getTime(in_stack_fffffffffffffe10),
         (double)in_stack_fffffffffffffe10 <
         (double)in_RDI[1].
                 super__List_base<XmlRpc::XmlRpcDispatch::MonitoredSource,_std::allocator<XmlRpc::XmlRpcDispatch::MonitoredSource>_>
                 ._M_impl._M_node.super__List_node_base._M_next ||
         (double)in_stack_fffffffffffffe10 ==
         (double)in_RDI[1].
                 super__List_base<XmlRpc::XmlRpcDispatch::MonitoredSource,_std::allocator<XmlRpc::XmlRpcDispatch::MonitoredSource>_>
                 ._M_impl._M_node.super__List_node_base._M_next)) {
        local_ac = 0;
      }
      else {
        local_ac = 3;
      }
    }
    std::vector<XmlRpc::XmlRpcSource_*,_std::allocator<XmlRpc::XmlRpcSource_*>_>::~vector
              ((vector<XmlRpc::XmlRpcSource_*,_std::allocator<XmlRpc::XmlRpcSource_*>_> *)
               CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20));
    std::vector<pollfd,_std::allocator<pollfd>_>::~vector
              ((vector<pollfd,_std::allocator<pollfd>_> *)
               CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20));
    if (local_ac != 0) {
      if (local_ac == 1) {
        return;
      }
      goto LAB_00562bfe;
    }
    in_stack_fffffffffffffe0c = 0;
  } while( true );
}

Assistant:

void XmlRpcDispatch::work(double timeout)
{
  // Loosely based on `man select` > Correspondence between select() and poll() notifications
  // and cloudius-systems/osv#35, cloudius-systems/osv@b53d39a using poll to emulate select
  const unsigned POLLIN_REQ = POLLIN; // Request read
  const unsigned POLLIN_CHK = (POLLIN | POLLHUP | POLLERR); // Readable or connection lost
  const unsigned POLLOUT_REQ = POLLOUT; // Request write
  const unsigned POLLOUT_CHK = (POLLOUT | POLLERR); // Writable or connection lost
#if !defined(_WIN32)
  const unsigned POLLEX_REQ = POLLPRI; // Out-of-band data received
  const unsigned POLLEX_CHK = (POLLPRI | POLLNVAL); // Out-of-band data or invalid fd
#else
  const unsigned POLLEX_REQ = POLLRDBAND; // Out-of-band data received
  const unsigned POLLEX_CHK = (POLLRDBAND | POLLNVAL); // Out-of-band data or invalid fd
#endif

  // Compute end time
  _endTime = (timeout < 0.0) ? -1.0 : (getTime() + timeout);
  _doClear = false;
  _inWork = true;
  int timeout_ms = static_cast<int>(floor(timeout * 1000.));

  // Only work while there is something to monitor
  while (!_sources.empty()) {

    // Construct the sets of descriptors we are interested in
    const unsigned source_cnt = _sources.size();
    std::vector<pollfd> fds(source_cnt);
    std::vector<XmlRpcSource *> sources(source_cnt);

    SourceList::iterator it;
    std::size_t i = 0;
    for (it=_sources.begin(); it!=_sources.end(); ++it, ++i) {
      sources[i] = it->getSource();
      fds[i].fd = sources[i]->getfd();
      fds[i].revents = 0; // some platforms may not clear this in poll()
      fds[i].events = 0;
      unsigned mask = it->getMask();
      if (mask & ReadableEvent)
        fds[i].events |= POLLIN_REQ;
      if (mask & WritableEvent)
        fds[i].events |= POLLOUT_REQ;
      if (mask & Exception)
        fds[i].events |= POLLEX_REQ;
    }

    // Check for events
    int nEvents = poll(&fds[0], source_cnt, (timeout_ms < 0) ? -1 : timeout_ms);

    if (nEvents < 0)
    {
#if defined(_WIN32)
      XmlRpcUtil::error("Error in XmlRpcDispatch::work: error in poll (%d).", WSAGetLastError());
#else
      if(errno != EINTR)
        XmlRpcUtil::error("Error in XmlRpcDispatch::work: error in poll (%d).", nEvents);
#endif
      _inWork = false;
      return;
    }

    // Process events
    for (i=0; i < source_cnt; ++i)
    {
      XmlRpcSource* src = sources[i];
      pollfd & pfd = fds[i];
      unsigned newMask = (unsigned) -1;
      // Only handle requested events to avoid being prematurely removed from dispatch
      bool readable = (pfd.events & POLLIN_REQ) == POLLIN_REQ;
      bool writable = (pfd.events & POLLOUT_REQ) == POLLOUT_REQ;
      bool oob = (pfd.events & POLLEX_REQ) == POLLEX_REQ;
      if (readable && (pfd.revents & POLLIN_CHK))
        newMask &= src->handleEvent(ReadableEvent);
      if (writable && (pfd.revents & POLLOUT_CHK))
        newMask &= src->handleEvent(WritableEvent);
      if (oob && (pfd.revents & POLLEX_CHK))
        newMask &= src->handleEvent(Exception);

      // Find the source iterator. It may have moved as a result of the way
      // that sources are removed and added in the call stack starting
      // from the handleEvent() calls above.
      SourceList::iterator thisIt;
      for (thisIt = _sources.begin(); thisIt != _sources.end(); thisIt++)
      {
        if(thisIt->getSource() == src)
          break;
      }
      if(thisIt == _sources.end())
      {
        XmlRpcUtil::error("Error in XmlRpcDispatch::work: couldn't find source iterator");
        continue;
      }

      if ( ! newMask) {
        _sources.erase(thisIt);  // Stop monitoring this one
        if ( ! src->getKeepOpen())
          src->close();
      } else if (newMask != (unsigned) -1) {
        thisIt->getMask() = newMask;
      }
    }

    // Check whether to clear all sources
    if (_doClear)
    {
      SourceList closeList = _sources;
      _sources.clear();
      for (MonitoredSource& ms: closeList) {
        XmlRpcSource* src = ms.getSource();
        assert(src);
        if (src)
          src->close();
      }
      _doClear = false;
    }

    // Check whether end time has passed
    if (0 <= _endTime && getTime() > _endTime)
      break;
  }

  _inWork = false;
}